

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O2

Set __thiscall
groundupdbext::FileKeyValueStore::getKeyValueSet(FileKeyValueStore *this,HashedValue *key)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  size_t __val;
  HashedValue *in_RDX;
  size_type sVar4;
  int iVar5;
  byte local_342;
  bool hasValue;
  int length;
  Type type;
  string cd;
  size_t hash;
  int entries;
  Bytes bytes;
  size_t hashSize;
  size_t lengthSize;
  unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
  values;
  string eol;
  string fp;
  string keyHash;
  ifstream t;
  
  __val = groundupdb::HashedValue::hash(in_RDX);
  std::__cxx11::to_string(&keyHash,__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&values,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  &key->m_has_value,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&values,
                 &keyHash);
  std::operator+(&fp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t,".kv");
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::~string((string *)&values);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&t,&fp,auto_format);
  bVar3 = std::filesystem::exists((path *)&t);
  std::filesystem::__cxx11::path::~path((path *)&t);
  if (bVar3) {
    std::ifstream::ifstream(&t,(string *)&fp,_S_in);
    values._M_h._M_buckets = &values._M_h._M_single_bucket;
    values._M_h._M_bucket_count = 1;
    values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    values._M_h._M_element_count = 0;
    values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    values._M_h._M_rehash_policy._M_next_resize = 0;
    values._M_h._M_single_bucket = (__node_base_ptr)0x0;
    eol._M_dataplus._M_p = (pointer)&eol.field_2;
    eol._M_string_length = 0;
    eol.field_2._M_local_buf[0] = '\0';
    std::istream::operator>>((istream *)&t,&entries);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&t,(string *)&eol);
    cd._M_dataplus._M_p = (pointer)&cd.field_2;
    cd._M_string_length = 0;
    cd.field_2._M_local_buf[0] = '\0';
    bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    length = 0;
    hash = 0;
    lengthSize = 4;
    hashSize = 8;
    for (iVar5 = 0; iVar5 < entries; iVar5 = iVar5 + 1) {
      std::istream::_M_extract<bool>((bool *)&t);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&t,(string *)&eol);
      if (hasValue == true) {
        cd._M_string_length = 0;
        *cd._M_dataplus._M_p = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&t,(string *)&cd);
        type = std::__cxx11::stoi(&cd,(size_t *)0x0,10);
        cd._M_string_length = 0;
        *cd._M_dataplus._M_p = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&t,(string *)&cd);
        length = std::__cxx11::stoi(&cd,&lengthSize,10);
        cd._M_string_length = 0;
        *cd._M_dataplus._M_p = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&t,(string *)&cd);
        if (bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start) {
          bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish =
               bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::vector<std::byte,_std::allocator<std::byte>_>::reserve(&bytes,cd._M_string_length);
        sVar2 = cd._M_string_length;
        _Var1 = cd._M_dataplus;
        for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
          local_342 = _Var1._M_p[sVar4];
          std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>
                    (&bytes,&local_342);
        }
        cd._M_string_length = 0;
        *cd._M_dataplus._M_p = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&t,(string *)&cd);
        hash = std::__cxx11::stoul(&cd,&hashSize,10);
        cd._M_string_length = 0;
        *cd._M_dataplus._M_p = '\0';
      }
      else {
        length = 0;
        type = UNKNOWN;
        hash = 0;
      }
      std::
      _Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_emplace<groundupdb::Type&,std::vector<std::byte,std::allocator<std::byte>>&,int&,unsigned_long&>
                ((_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&values,&type,&bytes,&length,&hash);
    }
    std::
    make_unique<std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>,std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>&>
              ((unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
                *)this);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              (&bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    std::__cxx11::string::~string((string *)&cd);
    std::__cxx11::string::~string((string *)&eol);
    std::
    _Hashtable<groundupdb::EncodedValue,_groundupdb::EncodedValue,_std::allocator<groundupdb::EncodedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::EncodedValue>,_std::hash<groundupdb::EncodedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&values._M_h);
    std::ifstream::~ifstream(&t);
  }
  else {
    std::
    make_unique<std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>>
              ();
  }
  std::__cxx11::string::~string((string *)&fp);
  std::__cxx11::string::~string((string *)&keyHash);
  return (__uniq_ptr_data<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>,_true,_true>
          )(__uniq_ptr_data<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>,_true,_true>
            )this;
}

Assistant:

Set
FileKeyValueStore::getKeyValueSet(const HashedValue& key) {
  // get from _string_set.kl file
  std::string keyHash(std::to_string(key.hash()));
  std::string fp(mImpl->m_fullpath + "/" + keyHash + ".kv");
  if (!fs::exists(fp)) {
    //std::cout << "FileKeyValueStore::getKeyValueSet returning empty set" << std::endl;
    return std::make_unique<std::unordered_set<EncodedValue>>(); // TODO verify we don't need to specify type here
  }
  std::ifstream t(fp);
  std::unordered_set<EncodedValue> values;

  // read size first
  int entries;
  std::string eol; // eol can be multiple characters
  t >> entries;
  std::getline(t,eol);

  // Each value information
  bool hasValue;
  groundupdb::Type type;
  int tint;
  std::string cd;
  Bytes bytes;
  int length = 0;
  std::size_t hash = 0;
  std::size_t lengthSize = sizeof(length);
  std::size_t hashSize = sizeof(hash);
  for (int i = 0;i < entries;i++) {
    // read hasValue
    t >> hasValue;
    std::getline(t,eol);
    if (hasValue) {
      //std::cout << "  Entry has value" << std::endl;
      // type
      cd.clear();
      std::getline(t,cd);
      //std::cout << "    Type string: " << cd << std::endl;
      //t >> tint; // DOESN'T WORK!
      tint = std::stoi(cd);
      type = (groundupdb::Type)tint;
      // length
      cd.clear();
      std::getline(t,cd);
      //std::cout << "    Length string: " << cd << std::endl;
      //t >> length; // DOESN'T WORK!
      length = std::stoi(cd,&lengthSize);
      // data
      cd.clear();
      std::getline(t,cd);
      bytes.clear();
      bytes.reserve(cd.length());
      //std::cout << "    Expecting " << length << " bytes, read line of " << cd.length() << " bytes" << std::endl;
      //std::cout << "    Reading bytes: ";
      for (auto& c : cd) {
        //std::cout << ".";
        bytes.push_back((std::byte)c);
      }
      //std::cout << std::endl;
      // hash
      cd.clear();
      std::getline(t,cd);
      //std::cout << "    Read hash value (string) of: " << cd << std::endl;
      //t >> hash; // DOESN'T WORK!
      hash = std::stoul(cd,&hashSize);
      //std::cout << "    Reading and creating SET value with length: " << length << ", hash: " << hash << std::endl;
      cd.clear();
    } else {
      //std::cout << "  Entry DOES NOT have value" << std::endl;
      length = 0;
      type = groundupdb::Type::UNKNOWN;
      hash = 0;
    }
    values.emplace(type,bytes,length,hash);
  }
  //std::cout << "FileKeyValueStore::getKeyValueSet returning read results of size: " << values.size() << ", but entries in file of: " << entries << std::endl;
  return std::make_unique<std::unordered_set<EncodedValue>>(values);
}